

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_MBCSSingleToBMPWithOffsets(UConverterToUnicodeArgs *pArgs,UErrorCode *pErrorCode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int32_t *piVar17;
  byte bVar18;
  uint8_t uVar19;
  UBool UVar20;
  int iVar21;
  uint8_t *puVar22;
  UChar *pUVar23;
  long local_90;
  size_t count_2;
  int32_t count_1;
  int32_t oredEntries;
  int32_t loops;
  int32_t count;
  int iStack_6c;
  uint8_t action;
  int32_t entry;
  int32_t sourceIndex;
  int32_t (*stateTable) [256];
  int32_t *offsets;
  int32_t length;
  int32_t targetCapacity;
  UChar *target;
  uint8_t *lastSource;
  uint8_t *sourceLimit;
  uint8_t *source;
  UConverter *cnv;
  UErrorCode *pErrorCode_local;
  UConverterToUnicodeArgs *pArgs_local;
  
  source = (uint8_t *)pArgs->converter;
  target = (UChar *)pArgs->source;
  lastSource = (uint8_t *)pArgs->sourceLimit;
  _length = pArgs->target;
  offsets._4_4_ = (int)((long)pArgs->targetLimit - (long)pArgs->target >> 1);
  stateTable = (int32_t (*) [256])pArgs->offsets;
  if ((((UConverter *)source)->options & 0x10) == 0) {
    _entry = (((UConverter *)source)->sharedData->mbcs).stateTable;
  }
  else {
    _entry = (((UConverter *)source)->sharedData->mbcs).swapLFNLStateTable;
  }
  iStack_6c = 0;
  offsets._0_4_ = (int)lastSource - (int)target;
  sourceLimit = (uint8_t *)target;
  cnv = (UConverter *)pErrorCode;
  pErrorCode_local = (UErrorCode *)pArgs;
  if ((int)offsets < offsets._4_4_) {
    offsets._4_4_ = (int)offsets;
  }
  do {
    if (0xf < offsets._4_4_) {
      oredEntries = offsets._4_4_ >> 4;
      do {
        uVar1 = (*_entry)[*sourceLimit];
        *_length = (UChar)uVar1;
        uVar2 = (*_entry)[sourceLimit[1]];
        _length[1] = (UChar)uVar2;
        uVar3 = (*_entry)[sourceLimit[2]];
        _length[2] = (UChar)uVar3;
        uVar4 = (*_entry)[sourceLimit[3]];
        _length[3] = (UChar)uVar4;
        uVar5 = (*_entry)[sourceLimit[4]];
        _length[4] = (UChar)uVar5;
        uVar6 = (*_entry)[sourceLimit[5]];
        _length[5] = (UChar)uVar6;
        uVar7 = (*_entry)[sourceLimit[6]];
        _length[6] = (UChar)uVar7;
        uVar8 = (*_entry)[sourceLimit[7]];
        _length[7] = (UChar)uVar8;
        uVar9 = (*_entry)[sourceLimit[8]];
        _length[8] = (UChar)uVar9;
        uVar10 = (*_entry)[sourceLimit[9]];
        _length[9] = (UChar)uVar10;
        uVar11 = (*_entry)[sourceLimit[10]];
        _length[10] = (UChar)uVar11;
        uVar12 = (*_entry)[sourceLimit[0xb]];
        _length[0xb] = (UChar)uVar12;
        uVar13 = (*_entry)[sourceLimit[0xc]];
        _length[0xc] = (UChar)uVar13;
        uVar14 = (*_entry)[sourceLimit[0xd]];
        _length[0xd] = (UChar)uVar14;
        uVar15 = (*_entry)[sourceLimit[0xe]];
        _length[0xe] = (UChar)uVar15;
        puVar22 = sourceLimit + 0x10;
        uVar16 = (*_entry)[sourceLimit[0xf]];
        pUVar23 = _length + 0x10;
        _length[0xf] = (UChar)uVar16;
        if (-0x7ff00001 <
            (int)(uVar16 | uVar15 | uVar14 | uVar13 | uVar12 | uVar11 | uVar10 | uVar9 | uVar8 | 
                                                  uVar7 | uVar6 | uVar5 | uVar4 | uVar3 | uVar2 | 
                                                  uVar1)) break;
        oredEntries = oredEntries + -1;
        _length = pUVar23;
        sourceLimit = puVar22;
      } while (0 < oredEntries);
      oredEntries = (offsets._4_4_ >> 4) - oredEntries;
      offsets._4_4_ = offsets._4_4_ + oredEntries * -0x10;
      if (stateTable != (int32_t (*) [256])0x0) {
        target = (UChar *)((long)target + (long)(oredEntries * 0x10));
        for (; 0 < oredEntries; oredEntries = oredEntries + -1) {
          (*stateTable)[0] = iStack_6c;
          (*stateTable)[1] = iStack_6c + 1;
          (*stateTable)[2] = iStack_6c + 2;
          (*stateTable)[3] = iStack_6c + 3;
          (*stateTable)[4] = iStack_6c + 4;
          (*stateTable)[5] = iStack_6c + 5;
          (*stateTable)[6] = iStack_6c + 6;
          (*stateTable)[7] = iStack_6c + 7;
          (*stateTable)[8] = iStack_6c + 8;
          (*stateTable)[9] = iStack_6c + 9;
          (*stateTable)[10] = iStack_6c + 10;
          (*stateTable)[0xb] = iStack_6c + 0xb;
          (*stateTable)[0xc] = iStack_6c + 0xc;
          (*stateTable)[0xd] = iStack_6c + 0xd;
          iVar21 = iStack_6c + 0xf;
          piVar17 = *stateTable;
          (*stateTable)[0xe] = iStack_6c + 0xe;
          iStack_6c = iStack_6c + 0x10;
          stateTable = (int32_t (*) [256])(*stateTable + 0x10);
          piVar17[0xf] = iVar21;
        }
      }
    }
    do {
      while( true ) {
        while( true ) {
          if (offsets._4_4_ < 1 || lastSource <= sourceLimit) goto LAB_0039719e;
          puVar22 = sourceLimit + 1;
          uVar1 = (*_entry)[*sourceLimit];
          sourceLimit = puVar22;
          if (-0x7ff00001 < (int)uVar1) break;
          *_length = (UChar)uVar1;
          offsets._4_4_ = offsets._4_4_ + -1;
          _length = _length + 1;
        }
        bVar18 = (byte)(uVar1 >> 0x14) & 0xf;
        if (bVar18 != 2) break;
        *_length = (UChar)uVar1;
        offsets._4_4_ = offsets._4_4_ + -1;
        _length = _length + 1;
      }
      if (bVar18 == 6) goto LAB_00397071;
    } while (bVar18 != 7);
    *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xc;
LAB_00397071:
    if (stateTable != (int32_t (*) [256])0x0) {
      count_2._4_4_ = (int)puVar22 - (int)target;
      while (count_2._4_4_ = count_2._4_4_ + -1, 0 < count_2._4_4_) {
        (*stateTable)[0] = iStack_6c;
        iStack_6c = iStack_6c + 1;
        stateTable = (int32_t (*) [256])(*stateTable + 1);
      }
    }
    UVar20 = U_FAILURE(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
    if (UVar20 != '\0') {
LAB_0039719e:
      UVar20 = U_SUCCESS(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
      if (((UVar20 != '\0') && (sourceLimit < lastSource)) &&
         (*(UChar **)(pErrorCode_local + 10) <= _length)) {
        *(undefined4 *)&cnv->fromUCharErrorBehaviour = 0xf;
      }
      if (stateTable != (int32_t (*) [256])0x0) {
        for (local_90 = (long)sourceLimit - (long)target; local_90 != 0; local_90 = local_90 + -1) {
          (*stateTable)[0] = iStack_6c;
          iStack_6c = iStack_6c + 1;
          stateTable = (int32_t (*) [256])(*stateTable + 1);
        }
      }
      *(uint8_t **)(pErrorCode_local + 4) = sourceLimit;
      *(UChar **)(pErrorCode_local + 8) = _length;
      *(int32_t (**) [256])(pErrorCode_local + 0xc) = stateTable;
      return;
    }
    target = (UChar *)sourceLimit;
    source[0x41] = sourceLimit[-1];
    uVar19 = _extToU((UConverter *)source,*(UConverterSharedData **)(source + 0x30),'\x01',
                     &sourceLimit,lastSource,(UChar **)&length,*(UChar **)(pErrorCode_local + 10),
                     (int32_t **)&stateTable,iStack_6c,*(byte *)((long)pErrorCode_local + 2),
                     (UErrorCode *)cnv);
    source[0x40] = uVar19;
    iStack_6c = ((int)sourceLimit - (int)target) + 1 + iStack_6c;
    UVar20 = U_FAILURE(*(UErrorCode *)&cnv->fromUCharErrorBehaviour);
    if (UVar20 != '\0') goto LAB_0039719e;
    offsets._4_4_ = (int)(*(undefined8 *)(pErrorCode_local + 10) - (long)_length >> 1);
    offsets._0_4_ = (int)lastSource - (int)sourceLimit;
    if ((int)offsets < offsets._4_4_) {
      offsets._4_4_ = (int)offsets;
    }
  } while( true );
}

Assistant:

static void
ucnv_MBCSSingleToBMPWithOffsets(UConverterToUnicodeArgs *pArgs,
                            UErrorCode *pErrorCode) {
    UConverter *cnv;
    const uint8_t *source, *sourceLimit, *lastSource;
    UChar *target;
    int32_t targetCapacity, length;
    int32_t *offsets;

    const int32_t (*stateTable)[256];

    int32_t sourceIndex;

    int32_t entry;
    uint8_t action;

    /* set up the local pointers */
    cnv=pArgs->converter;
    source=(const uint8_t *)pArgs->source;
    sourceLimit=(const uint8_t *)pArgs->sourceLimit;
    target=pArgs->target;
    targetCapacity=(int32_t)(pArgs->targetLimit-pArgs->target);
    offsets=pArgs->offsets;

    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        stateTable=(const int32_t (*)[256])cnv->sharedData->mbcs.swapLFNLStateTable;
    } else {
        stateTable=cnv->sharedData->mbcs.stateTable;
    }

    /* sourceIndex=-1 if the current character began in the previous buffer */
    sourceIndex=0;
    lastSource=source;

    /*
     * since the conversion here is 1:1 UChar:uint8_t, we need only one counter
     * for the minimum of the sourceLength and targetCapacity
     */
    length=(int32_t)(sourceLimit-source);
    if(length<targetCapacity) {
        targetCapacity=length;
    }

#if MBCS_UNROLL_SINGLE_TO_BMP
    /* unrolling makes it faster on Pentium III/Windows 2000 */
    /* unroll the loop with the most common case */
unrolled:
    if(targetCapacity>=16) {
        int32_t count, loops, oredEntries;

        loops=count=targetCapacity>>4;
        do {
            oredEntries=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            oredEntries|=entry=stateTable[0][*source++];
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);

            /* were all 16 entries really valid? */
            if(!MBCS_ENTRY_FINAL_IS_VALID_DIRECT_16(oredEntries)) {
                /* no, return to the first of these 16 */
                source-=16;
                target-=16;
                break;
            }
        } while(--count>0);
        count=loops-count;
        targetCapacity-=16*count;

        if(offsets!=NULL) {
            lastSource+=16*count;
            while(count>0) {
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                *offsets++=sourceIndex++;
                --count;
            }
        }
    }
#endif

    /* conversion loop */
    while(targetCapacity > 0 && source < sourceLimit) {
        entry=stateTable[0][*source++];
        /* MBCS_ENTRY_IS_FINAL(entry) */

        /* test the most common case first */
        if(MBCS_ENTRY_FINAL_IS_VALID_DIRECT_16(entry)) {
            /* output BMP code point */
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            --targetCapacity;
            continue;
        }

        /*
         * An if-else-if chain provides more reliable performance for
         * the most common cases compared to a switch.
         */
        action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
        if(action==MBCS_STATE_FALLBACK_DIRECT_16) {
            if(UCNV_TO_U_USE_FALLBACK(cnv)) {
                /* output BMP code point */
                *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                --targetCapacity;
                continue;
            }
        } else if(action==MBCS_STATE_UNASSIGNED) {
            /* just fall through */
        } else if(action==MBCS_STATE_ILLEGAL) {
            /* callback(illegal) */
            *pErrorCode=U_ILLEGAL_CHAR_FOUND;
        } else {
            /* reserved, must never occur */
            continue;
        }

        /* set offsets since the start or the last extension */
        if(offsets!=NULL) {
            int32_t count=(int32_t)(source-lastSource);

            /* predecrement: do not set the offset for the callback-causing character */
            while(--count>0) {
                *offsets++=sourceIndex++;
            }
            /* offset and sourceIndex are now set for the current character */
        }

        if(U_FAILURE(*pErrorCode)) {
            /* callback(illegal) */
            break;
        } else /* unassigned sequences indicated with byteIndex>0 */ {
            /* try an extension mapping */
            lastSource=source;
            cnv->toUBytes[0]=*(source-1);
            cnv->toULength=_extToU(cnv, cnv->sharedData,
                                    1, &source, sourceLimit,
                                    &target, pArgs->targetLimit,
                                    &offsets, sourceIndex,
                                    pArgs->flush,
                                    pErrorCode);
            sourceIndex+=1+(int32_t)(source-lastSource);

            if(U_FAILURE(*pErrorCode)) {
                /* not mappable or buffer overflow */
                break;
            }

            /* recalculate the targetCapacity after an extension mapping */
            targetCapacity=(int32_t)(pArgs->targetLimit-target);
            length=(int32_t)(sourceLimit-source);
            if(length<targetCapacity) {
                targetCapacity=length;
            }
        }

#if MBCS_UNROLL_SINGLE_TO_BMP
        /* unrolling makes it faster on Pentium III/Windows 2000 */
        goto unrolled;
#endif
    }

    if(U_SUCCESS(*pErrorCode) && source<sourceLimit && target>=pArgs->targetLimit) {
        /* target is full */
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }

    /* set offsets since the start or the last callback */
    if(offsets!=NULL) {
        size_t count=source-lastSource;
        while(count>0) {
            *offsets++=sourceIndex++;
            --count;
        }
    }

    /* write back the updated pointers */
    pArgs->source=(const char *)source;
    pArgs->target=target;
    pArgs->offsets=offsets;
}